

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::InitHostFunctionsAndTTData
          (ThreadContext *this,bool record,bool replay,bool debug,size_t optTTUriLength,
          char *optTTUri,TTDOpenResourceStreamCallback openResourceStreamfp,
          TTDReadBytesFromStreamCallback readBytesFromStreamfp,
          TTDWriteBytesToStreamCallback writeBytesToStreamfp,
          TTDFlushAndCloseStreamCallback flushAndCloseStreamfp,
          TTDCreateExternalObjectCallback createExternalObjectfp,
          TTDCreateJsRTContextCallback createJsRTContextCallbackfp,
          TTDReleaseJsRTContextCallback releaseJsRTContextCallbackfp,
          TTDSetActiveJsRTContext setActiveJsRTContextfp)

{
  ThreadContextTTD *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  HeapAllocator *alloc;
  ExecutionInfoManager *this_00;
  undefined1 local_c0 [8];
  TrackAllocData data;
  TTInnerLoopLastStatementInfo lsi;
  TTDebuggerSourceLocation dsl;
  
  if (this->TTDLog == (EventLog *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x7dd,"(this->IsRuntimeInTTDMode())","Need to call init first.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pTVar1 = this->TTDContext;
  (pTVar1->TTDataIOInfo).pfOpenResourceStream = openResourceStreamfp;
  (pTVar1->TTDataIOInfo).pfReadBytesFromStream = readBytesFromStreamfp;
  (pTVar1->TTDataIOInfo).pfWriteBytesToStream = writeBytesToStreamfp;
  (pTVar1->TTDataIOInfo).pfFlushAndCloseStream = flushAndCloseStreamfp;
  (pTVar1->TTDataIOInfo).ActiveTTUriLength = 0;
  (pTVar1->TTDataIOInfo).ActiveTTUri = (char *)0x0;
  pTVar1 = this->TTDContext;
  (pTVar1->TTDExternalObjectFunctions).pfCreateExternalObject = createExternalObjectfp;
  (pTVar1->TTDExternalObjectFunctions).pfCreateJsRTContextCallback = createJsRTContextCallbackfp;
  (pTVar1->TTDExternalObjectFunctions).pfReleaseJsRTContextCallback = releaseJsRTContextCallbackfp;
  (pTVar1->TTDExternalObjectFunctions).pfSetActiveJsRTContext = setActiveJsRTContextfp;
  if (record) {
    if (optTTUri != (char *)0x0) {
      TTDAbort_unrecoverable_error
                ("No URI is needed in record mode (the host explicitly provides it when writing.");
    }
    TTD::EventLog::InitForTTDRecord(this->TTDLog,debug);
  }
  else {
    if (optTTUri == (char *)0x0) {
      TTDAbort_unrecoverable_error
                ("We need a URI in replay mode so we can initialize the log from it");
    }
    TTD::EventLog::InitForTTDReplay
              (this->TTDLog,&this->TTDContext->TTDataIOInfo,optTTUri,optTTUriLength,debug);
    uVar4 = TTD::EventLog::GetSourceInfoCount(this->TTDLog);
    this->sourceInfoCount = uVar4;
  }
  if (debug) {
    TTD::TTInnerLoopLastStatementInfo::TTInnerLoopLastStatementInfo
              ((TTInnerLoopLastStatementInfo *)&data.line);
    TTD::TTDebuggerSourceLocation::TTDebuggerSourceLocation((TTDebuggerSourceLocation *)&lsi.m_line)
    ;
    TTD::EventLog::LoadLastSourceLineInfo
              (this->TTDLog,(TTInnerLoopLastStatementInfo *)&data.line,
               (TTDebuggerSourceLocation *)&lsi.m_line);
    local_c0 = (undefined1  [8])&TTD::ExecutionInfoManager::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3154530;
    data.filename._0_4_ = 0x7f9;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_c0);
    this_00 = (ExecutionInfoManager *)new<Memory::HeapAllocator>(0x248,alloc,0x300d4a);
    TTD::ExecutionInfoManager::ExecutionInfoManager
              (this_00,(TTInnerLoopLastStatementInfo *)&data.line);
    this->TTDExecutionInfo = this_00;
    bVar3 = TTD::TTDebuggerSourceLocation::HasValue((TTDebuggerSourceLocation *)&lsi.m_line);
    if (bVar3) {
      TTD::ExecutionInfoManager::SetPendingTTDToTarget
                (this->TTDExecutionInfo,(TTDebuggerSourceLocation *)&lsi.m_line);
    }
    TTD::TTDebuggerSourceLocation::~TTDebuggerSourceLocation
              ((TTDebuggerSourceLocation *)&lsi.m_line);
  }
  return;
}

Assistant:

void ThreadContext::InitHostFunctionsAndTTData(bool record, bool replay, bool debug, size_t optTTUriLength, const char* optTTUri,
    TTD::TTDOpenResourceStreamCallback openResourceStreamfp, TTD::TTDReadBytesFromStreamCallback readBytesFromStreamfp,
    TTD::TTDWriteBytesToStreamCallback writeBytesToStreamfp, TTD::TTDFlushAndCloseStreamCallback flushAndCloseStreamfp,
    TTD::TTDCreateExternalObjectCallback createExternalObjectfp,
    TTD::TTDCreateJsRTContextCallback createJsRTContextCallbackfp, TTD::TTDReleaseJsRTContextCallback releaseJsRTContextCallbackfp, TTD::TTDSetActiveJsRTContext setActiveJsRTContextfp)
{
    AssertMsg(this->IsRuntimeInTTDMode(), "Need to call init first.");

    this->TTDContext->TTDataIOInfo = { openResourceStreamfp, readBytesFromStreamfp, writeBytesToStreamfp, flushAndCloseStreamfp, 0, nullptr };
    this->TTDContext->TTDExternalObjectFunctions = { createExternalObjectfp, createJsRTContextCallbackfp, releaseJsRTContextCallbackfp, setActiveJsRTContextfp };

    if(record)
    {
        TTDAssert(optTTUri == nullptr, "No URI is needed in record mode (the host explicitly provides it when writing.");

        this->TTDLog->InitForTTDRecord(debug);
    }
    else
    {
        TTDAssert(optTTUri != nullptr, "We need a URI in replay mode so we can initialize the log from it");

        this->TTDLog->InitForTTDReplay(this->TTDContext->TTDataIOInfo, optTTUri, optTTUriLength, debug);
        this->sourceInfoCount = this->TTDLog->GetSourceInfoCount();
    }

#if !ENABLE_TTD_DIAGNOSTICS_TRACING
    if(debug)
    {
#endif

        TTD::TTInnerLoopLastStatementInfo lsi;
        TTD::TTDebuggerSourceLocation dsl;
        this->TTDLog->LoadLastSourceLineInfo(lsi, dsl);

        this->TTDExecutionInfo = HeapNew(TTD::ExecutionInfoManager, lsi);
        if(dsl.HasValue())
        {
            this->TTDExecutionInfo->SetPendingTTDToTarget(dsl);
        }

#if !ENABLE_TTD_DIAGNOSTICS_TRACING
    }
#endif
}
#endif

BOOL
ThreadContext::ExecuteRecyclerCollectionFunction(Recycler * recycler, CollectionFunction function, CollectionFlags flags)
{
    // If the thread context doesn't have an associated Recycler set, don't do anything
    if (this->recycler == nullptr)
    {
        return FALSE;
    }

    // Take etw rundown lock on this thread context. We can't collect entryPoints if we are in etw rundown.
    AutoCriticalSection autocs(this->GetFunctionBodyLock());

    // Disable calling dispose from leave script or the stack probe
    // while we're executing the recycler wrapper
    AutoRestoreValue<bool> callDispose(&this->callDispose, false);

    BOOL ret = FALSE;


#if ENABLE_TTD
    //
    //TODO: We lose any events that happen in the callbacks (such as JsRelease) which may be a problem in the future.
    //      It may be possible to defer the collection of these objects to an explicit collection at the yield loop (same for weak set/map).
    //      We already indirectly do this for ScriptContext collection (but that is buggy so needs to be fixed too).
    //
    if(this->IsRuntimeInTTDMode())
    {
        this->TTDLog->PushMode(TTD::TTDMode::ExcludedExecutionTTAction);
    }
#endif

    if (!this->IsScriptActive())
    {
        Assert(!this->IsDisableImplicitCall() || this->IsInAsyncHostOperation());
        ret = this->ExecuteRecyclerCollectionFunctionCommon(recycler, function, flags);

        // Make sure that we finish a collect that is activated outside of script, since
        // we won't have exit script to schedule it
        if (!this->IsInScript() && recycler->CollectionInProgress()
            && ((flags & CollectOverride_DisableIdleFinish) == 0) && threadServiceWrapper)
        {
            threadServiceWrapper->ScheduleFinishConcurrent();
        }
    }
    else
    {
        void * frameAddr = nullptr;
        GET_CURRENT_FRAME_ID(frameAddr);

        // We may need stack to call out from Dispose or QC
        if (!this->IsDisableImplicitCall()) // otherwise Dispose/QC disabled
        {
            // If we don't have stack space to call out from Dispose or QC,
            // don't throw, simply return false. This gives SnailAlloc a better
            // chance of allocating in low stack-space situations (like allocating
            // a StackOverflowException object)
            if (!this->IsStackAvailableNoThrow(Js::Constants::MinStackCallout))
            {
                return false;
            }
        }

        this->LeaveScriptStart<false>(frameAddr);
        ret = this->ExecuteRecyclerCollectionFunctionCommon(recycler, function, flags);
        this->LeaveScriptEnd<false>(frameAddr);

        // After OOM changed to fatal error, this throw still exists on allocation path
        if (this->callRootLevel != 0)
        {
            this->CheckScriptInterrupt();
        }
    }

#if ENABLE_TTD
    if(this->IsRuntimeInTTDMode())
    {
        this->TTDLog->PopMode(TTD::TTDMode::ExcludedExecutionTTAction);
    }
#endif

    return ret;
}

void
ThreadContext::DisposeObjects(Recycler * recycler)
{
    if (this->IsDisableImplicitCall())
    {
        // Don't dispose objects when implicit calls are disabled, since disposing may cause implicit calls. Objects will remain
        // in the dispose queue and will be disposed later when implicit calls are not disabled.
        return;
    }

    // We shouldn't DisposeObjects in NoScriptScope as this might lead to script execution.
    // Callers of DisposeObjects should ensure !IsNoScriptScope() before calling DisposeObjects.
    if (this->IsNoScriptScope())
    {
        FromDOM_NoScriptScope_unrecoverable_error();
    }

    if (!this->IsScriptActive())
    {
        __super::DisposeObjects(recycler);
    }
    else
    {
        void * frameAddr = nullptr;
        GET_CURRENT_FRAME_ID(frameAddr);

        // We may need stack to call out from Dispose
        // This code path is not in GC on allocation code path any more, it's OK to throw here
        this->ProbeStack(Js::Constants::MinStackCallout);

        this->LeaveScriptStart<false>(frameAddr);
        __super::DisposeObjects(recycler);
        this->LeaveScriptEnd<false>(frameAddr);
    }
}

void
ThreadContext::PushEntryExitRecord(Js::ScriptEntryExitRecord * record)
{
    AssertMsg(record, "Didn't provide a script entry record to push");
    Assert(record->next == nullptr);


    Js::ScriptEntryExitRecord * lastRecord = this->entryExitRecord;
    if (lastRecord != nullptr)
    {
        // If we enter script again, we should have leave with leaveForHost or leave for dispose.
        Assert(lastRecord->leaveForHost || lastRecord->leaveForAsyncHostOperation);
        lastRecord->hasReentered = true;
        record->next = lastRecord;

        // these are on stack, which grows down. if this condition doesn't hold,
        // then the list somehow got messed up
        if (
#if defined(JSRT_VERIFY_RUNTIME_STATE) || defined(DEBUG)
            !IsOnStack(lastRecord) ||
#endif
            ((uintptr_t)record >= (uintptr_t)lastRecord
                && !IS_ASAN_FAKE_STACK_ADDR(record)
                && !IS_ASAN_FAKE_STACK_ADDR(lastRecord)))
        {
            EntryExitRecord_Corrupted_unrecoverable_error();
        }
    }

    this->entryExitRecord = record;
}

void ThreadContext::PopEntryExitRecord(Js::ScriptEntryExitRecord * record)
{
    AssertMsg(record && record == this->entryExitRecord, "Mismatch script entry/exit");

    // these are on stack, which grows down. if this condition doesn't hold,
    // then the list somehow got messed up
    Js::ScriptEntryExitRecord * next = this->entryExitRecord->next;
    if (next && (
#if defined(JSRT_VERIFY_RUNTIME_STATE) || defined(DEBUG)
        !IsOnStack(next) ||
#endif
        ((uintptr_t)this->entryExitRecord >= (uintptr_t)next
            && !IS_ASAN_FAKE_STACK_ADDR(this->entryExitRecord)
            && !IS_ASAN_FAKE_STACK_ADDR(next))))
    {
        EntryExitRecord_Corrupted_unrecoverable_error();
    }

    this->entryExitRecord = next;
}

BOOL ThreadContext::ReserveStaticTypeIds(__in int first, __in int last)
{
    if ( nextTypeId <= first )
    {
        nextTypeId = (Js::TypeId) last;
        return TRUE;
    }
    else
    {
        return FALSE;
    }
}

Js::TypeId ThreadContext::ReserveTypeIds(int count)
{
    Js::TypeId firstTypeId = nextTypeId;
    nextTypeId = (Js::TypeId)(nextTypeId + count);
    return firstTypeId;
}

Js::TypeId ThreadContext::CreateTypeId()
{
    return nextTypeId = (Js::TypeId)(nextTypeId + 1);
}

void ThreadContext::SetWellKnownHostTypeId(WellKnownHostType wellKnownType, Js::TypeId typeId)
{
    AssertMsg(wellKnownType <= WellKnownHostType_Last, "ThreadContext::SetWellKnownHostTypeId called on unknown type");

    if (wellKnownType >= 0 && wellKnownType <= WellKnownHostType_Last)
    {
        this->wellKnownHostTypeIds[wellKnownType] = typeId;
#if ENABLE_NATIVE_CODEGEN
        // The jit server really only needs to know about WellKnownHostType_HTMLAllCollection
        if (this->m_remoteThreadContextInfo && wellKnownType == WellKnownHostType_HTMLAllCollection)
        {
            HRESULT hr = JITManager::GetJITManager()->SetWellKnownHostTypeId(this->m_remoteThreadContextInfo, (int)typeId);
            JITManager::HandleServerCallResult(hr, RemoteCallType::StateUpdate);
        }
#endif
    }
}

#ifdef ENABLE_SCRIPT_DEBUGGING
void ThreadContext::EnsureDebugManager()
{
    if (this->debugManager == nullptr)
    {
        this->debugManager = HeapNew(Js::DebugManager, this, this->GetAllocationPolicyManager());
    }
    InterlockedIncrement(&crefSContextForDiag);
    Assert(this->debugManager != nullptr);
}

void ThreadContext::ReleaseDebugManager()
{
    Assert(crefSContextForDiag > 0);
    Assert(this->debugManager != nullptr);

    LONG lref = InterlockedDecrement(&crefSContextForDiag);

    if (lref == 0)
    {
        if (this->recyclableData != nullptr)
        {
            this->recyclableData->returnedValueList = nullptr;
        }

        if (this->debugManager != nullptr)
        {
            this->debugManager->Close();
            HeapDelete(this->debugManager);
            this->debugManager = nullptr;
        }
    }
}

#endif

Js::TempArenaAllocatorObject *
ThreadContext::GetTemporaryAllocator(LPCWSTR name)
{
    AssertCanHandleOutOfMemory();

    if (temporaryArenaAllocatorCount != 0)
    {
        temporaryArenaAllocatorCount--;
        Js::TempArenaAllocatorObject * allocator = recyclableData->temporaryArenaAllocators[temporaryArenaAllocatorCount];
        recyclableData->temporaryArenaAllocators[temporaryArenaAllocatorCount] = nullptr;
        return allocator;
    }

    return Js::TempArenaAllocatorObject::Create(this);
}

void
ThreadContext::ReleaseTemporaryAllocator(Js::TempArenaAllocatorObject * tempAllocator)
{
    if (temporaryArenaAllocatorCount < MaxTemporaryArenaAllocators)
    {
        tempAllocator->GetAllocator()->Reset();
        recyclableData->temporaryArenaAllocators[temporaryArenaAllocatorCount] = tempAllocator;
        temporaryArenaAllocatorCount++;
        return;
    }

    tempAllocator->Dispose(false);
}


Js::TempGuestArenaAllocatorObject *
ThreadContext::GetTemporaryGuestAllocator(LPCWSTR name)
{
    AssertCanHandleOutOfMemory();

    if (temporaryGuestArenaAllocatorCount != 0)
    {
        temporaryGuestArenaAllocatorCount--;
        Js::TempGuestArenaAllocatorObject * allocator = recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount];
        allocator->AdviseInUse();
        recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount] = nullptr;
        return allocator;
    }

    return Js::TempGuestArenaAllocatorObject::Create(this);
}

void
ThreadContext::ReleaseTemporaryGuestAllocator(Js::TempGuestArenaAllocatorObject * tempGuestAllocator)
{
    if (temporaryGuestArenaAllocatorCount < MaxTemporaryArenaAllocators)
    {
        tempGuestAllocator->AdviseNotInUse();
        recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount] = tempGuestAllocator;
        temporaryGuestArenaAllocatorCount++;
        return;
    }

    tempGuestAllocator->Dispose(false);
}

void
ThreadContext::AddToPendingScriptContextCloseList(Js::ScriptContext * scriptContext)
{
    Assert(scriptContext != nullptr);

    if (rootPendingClose == nullptr)
    {
        rootPendingClose = scriptContext;
        return;
    }

    // Prepend to the list.
    scriptContext->SetNextPendingClose(rootPendingClose);
    rootPendingClose = scriptContext;
}

void
ThreadContext::RemoveFromPendingClose(Js::ScriptContext * scriptContext)
{
    Assert(scriptContext != nullptr);

    if (rootPendingClose == nullptr)
    {
        // We already sent a close message, ignore the notification.
        return;
    }

    // Base case: The root is being removed. Move the root along.
    if (scriptContext == rootPendingClose)
    {
        rootPendingClose = rootPendingClose->GetNextPendingClose();
        return;
    }

    Js::ScriptContext * currScriptContext = rootPendingClose;
    Js::ScriptContext * nextScriptContext = nullptr;
    while (currScriptContext)
    {
        nextScriptContext = currScriptContext->GetNextPendingClose();
        if (!nextScriptContext)
        {
            break;
        }

        if (nextScriptContext == scriptContext) {
            // The next pending close ScriptContext is the one to be removed - set prev->next to next->next
            currScriptContext->SetNextPendingClose(nextScriptContext->GetNextPendingClose());
            return;
        }
        currScriptContext = nextScriptContext;
    }

    // We expect to find scriptContext in the pending close list.
    Assert(false);
}

void ThreadContext::ClosePendingScriptContexts()
{
    Js::ScriptContext * scriptContext = rootPendingClose;
    if (scriptContext == nullptr)
    {
        return;
    }
    Js::ScriptContext * nextScriptContext;
    do
    {
        nextScriptContext = scriptContext->GetNextPendingClose();
        scriptContext->Close(false);
        scriptContext = nextScriptContext;
    }
    while (scriptContext);
    rootPendingClose = nullptr;
}

void
ThreadContext::RegisterScriptContext(Js::ScriptContext *scriptContext)
{
    // NOTE: ETW rundown thread may be reading the scriptContextList concurrently. We don't need to
    // lock access because we only insert to the front here.

    scriptContext->next = this->scriptContextList;
    if (this->scriptContextList)
    {
        Assert(this->scriptContextList->prev == NULL);
        this->scriptContextList->prev = scriptContext;
    }
    scriptContext->prev = NULL;
    this->scriptContextList = scriptContext;

    if(NoJIT())
    {
        scriptContext->ForceNoNative();
    }

    if (NoDynamicThunks())
    {
        scriptContext->ForceNoDynamicThunks();
    }

#if DBG || defined(RUNTIME_DATA_COLLECTION)
    scriptContextCount++;
#endif
    scriptContextEverRegistered = true;
}

void
ThreadContext::UnregisterScriptContext(Js::ScriptContext *scriptContext)
{
    // NOTE: ETW rundown thread may be reading the scriptContextList concurrently. Since this function
    // is only called by ~ScriptContext() which already synchronized to ETW rundown, we are safe here.

    if (scriptContext == this->scriptContextList)
    {
        Assert(scriptContext->prev == NULL);
        this->scriptContextList = scriptContext->next;
    }
    else
    {
        scriptContext->prev->next = scriptContext->next;
    }

    if (scriptContext->next)
    {
        scriptContext->next->prev = scriptContext->prev;
    }
    scriptContext->prev = nullptr;
    scriptContext->next = nullptr;
#if DBG || defined(RUNTIME_DATA_COLLECTION)
    scriptContextCount--;
#endif
}

ThreadContext::CollectCallBack *
ThreadContext::AddRecyclerCollectCallBack(RecyclerCollectCallBackFunction callback, void * context)
{
    AutoCriticalSection autocs(&csCollectionCallBack);
    CollectCallBack * collectCallBack = this->collectCallBackList.PrependNode(&HeapAllocator::Instance);
    collectCallBack->callback = callback;
    collectCallBack->context = context;
    this->hasCollectionCallBack = true;
    return collectCallBack;
}

void
ThreadContext::RemoveRecyclerCollectCallBack(ThreadContext::CollectCallBack * collectCallBack)
{
    AutoCriticalSection autocs(&csCollectionCallBack);
    this->collectCallBackList.RemoveElement(&HeapAllocator::Instance, collectCallBack);
    this->hasCollectionCallBack = !this->collectCallBackList.Empty();
}

void
ThreadContext::PreCollectionCallBack(CollectionFlags flags)
{
#ifdef PERF_COUNTERS
    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: deferparse - # of func: %d # deferparsed: %d\n"), PerfCounter::CodeCounterSet::GetTotalFunctionCounter().GetValue(), PerfCounter::CodeCounterSet::GetDeferredFunctionCounter().GetValue());
#endif

    // This needs to be done before ClearInlineCaches since that method can empty the list of
    // script contexts with inline caches
    this->ClearScriptContextCaches();

    // Clear up references to types to avoid keeping them alive
    this->noSpecialPropertyRegistry.Clear();
    this->onlyWritablePropertyRegistry.Clear();

    // Clean up unused memory before we start collecting
    this->CleanNoCasePropertyMap();
    this->TryEnterExpirableCollectMode();

    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL partial = flags & CollectMode_Partial;

    if (!partial)
    {
        // Integrate allocated pages from background JIT threads
#if ENABLE_NATIVE_CODEGEN
#if !FLOATVAR
        if (codeGenNumberThreadAllocator)
        {
            codeGenNumberThreadAllocator->Integrate();
        }
        if (this->xProcNumberPageSegmentManager)
        {
            this->xProcNumberPageSegmentManager->Integrate();
        }
#endif
#endif
    }

    RecyclerCollectCallBackFlags callBackFlags = (RecyclerCollectCallBackFlags)
        ((concurrent ? Collect_Begin_Concurrent : Collect_Begin) | (partial? Collect_Begin_Partial : Collect_Begin));
    CollectionCallBack(callBackFlags);
}

void
ThreadContext::PreSweepCallback()
{
    CollectionCallBack(Collect_Begin_Sweep);

#ifdef PERSISTENT_INLINE_CACHES
    ClearInlineCachesWithDeadWeakRefs();
#else
    ClearInlineCaches();
#endif

    ClearIsInstInlineCaches();

    ClearEquivalentTypeCaches();

    ClearEnumeratorCaches();

    this->dynamicObjectEnumeratorCacheMap.Clear();
}

void
ThreadContext::PreRescanMarkCallback()
{
    // If this feature is turned off or if we're already in profile collection mode, do nothing
    // We also do nothing if expiration is explicitly disabled by someone lower down the stack
    if (!PHASE_OFF1(Js::ExpirableCollectPhase) && InExpirableCollectMode() && !this->disableExpiration)
    {
        this->DoExpirableCollectModeStackWalk();
    }
}

void
ThreadContext::DoExpirableCollectModeStackWalk()
{
    if (this->entryExitRecord != nullptr)
    {
        // If we're in script, we will do a stack walk, find the JavascriptFunction's on the stack
        // and mark their entry points as being used so that we don't prematurely expire them

        Js::ScriptContext* topScriptContext = this->entryExitRecord->scriptContext;
        Js::JavascriptStackWalker walker(topScriptContext, TRUE);

        Js::JavascriptFunction* javascriptFunction = nullptr;
        while (walker.GetCallerWithoutInlinedFrames(&javascriptFunction))
        {
            if (javascriptFunction != nullptr && Js::ScriptFunction::Test(javascriptFunction))
            {
                Js::ScriptFunction* scriptFunction = (Js::ScriptFunction*) javascriptFunction;

                scriptFunction->GetFunctionBody()->MapEntryPoints([](int index, Js::FunctionEntryPointInfo* entryPoint){
                    entryPoint->SetIsObjectUsed();
                });

                // Make sure we marked the current one when iterating all entry points
                Js::ProxyEntryPointInfo* entryPointInfo = scriptFunction->GetEntryPointInfo();
                Assert(entryPointInfo == nullptr
                    || !entryPointInfo->IsFunctionEntryPointInfo()
                    || ((Js::FunctionEntryPointInfo*)entryPointInfo)->IsObjectUsed());
            }
        }
    }
}

void
ThreadContext::CollectionCallBack(RecyclerCollectCallBackFlags flags)
{
    DListBase<CollectCallBack>::Iterator i(&this->collectCallBackList);
    while (i.Next())
    {
        i.Data().callback(i.Data().context, flags);
    }
}

void
ThreadContext::WaitCollectionCallBack()
{
    // Avoid taking the lock if there are no call back
    if (hasCollectionCallBack)
    {
        AutoCriticalSection autocs(&csCollectionCallBack);
        CollectionCallBack(Collect_Wait);
    }
}

void
ThreadContext::PostCollectionCallBack()
{
    CollectionCallBack(Collect_End);

    TryExitExpirableCollectMode();

    // Recycler is null in the case where the ThreadContext is in the process of creating the recycler and
    // we have a GC triggered (say because the -recyclerStress flag is passed in)
    if (this->recycler != NULL)
    {
        if (this->recycler->InCacheCleanupCollection())
        {
            this->recycler->ClearCacheCleanupCollection();
            for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
            {
                scriptContext->CleanupWeakReferenceDictionaries();
            }
        }
    }
}

void
ThreadContext::PostSweepRedeferralCallBack()
{
    if (this->DoTryRedeferral())
    {
        HRESULT hr = S_OK;
        BEGIN_TRANSLATE_OOM_TO_HRESULT
        {
            this->TryRedeferral();
        }
        END_TRANSLATE_OOM_TO_HRESULT(hr);
    }

    this->UpdateRedeferralState();
}